

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_filter_pushdown_optimizer.cpp
# Opt level: O1

void __thiscall
duckdb::JoinFilterPushdownOptimizer::GenerateJoinFilters
          (JoinFilterPushdownOptimizer *this,LogicalComparisonJoin *join)

{
  iterator __position;
  LogicalGet *pLVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pJVar2;
  _Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false> __ptr;
  idx_t iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *pvVar8;
  vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  *pvVar9;
  vector<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
  *pvVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar11;
  _Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false> _Var12;
  pointer pPVar13;
  undefined8 uVar14;
  uint uVar15;
  reference pvVar16;
  pointer pEVar17;
  BoundColumnRefExpression *pBVar18;
  reference this_01;
  type op;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  pointer pJVar19;
  pointer pBVar20;
  long lVar21;
  DynamicTableFilterSet *__tmp;
  size_type *psVar22;
  pointer pAVar23;
  undefined1 *__n;
  aggregate_size_t *pp_Var24;
  undefined8 *puVar25;
  pointer pPVar26;
  bool bVar27;
  byte bVar28;
  templated_unique_single_t pushdown_info;
  unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
  aggr_expr;
  vector<duckdb::PushdownFilterTarget,_true> pushdown_filter_targets;
  vector<duckdb::JoinFilterPushdownColumn,_true> pushdown_columns;
  vector<duckdb::AggregateFunction,_true> aggr_functions;
  FunctionBinder function_binder;
  JoinFilterPushdownColumn pushdown_col;
  _Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false> local_370;
  FunctionBinder local_368;
  vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_> local_358;
  _func_int **local_340;
  vector<duckdb::JoinCondition,_true> *local_338;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_330;
  vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  local_328;
  LogicalComparisonJoin *local_310;
  undefined1 local_308 [16];
  pointer local_2f8;
  size_type *local_2e8;
  JoinFilterPushdownOptimizer *local_2e0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_2d8;
  vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  local_2c0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [12];
  undefined4 uStack_28c;
  undefined1 local_288 [280];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  BaseScalarFunction local_160;
  undefined8 local_b0 [13];
  undefined2 local_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_358.
  super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_358.
       super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
       ._M_impl.super__Vector_impl_data._M_start;
  bVar28 = 0;
  uVar15 = (uint)(byte)(join->super_LogicalJoin).super_LogicalOperator.field_0x61;
  if ((10 < uVar15) || ((0x7d2U >> (uVar15 & 0x1f) & 1) == 0)) {
    local_338 = &join->conditions;
    PhysicalComparisonJoin::ReorderConditions(local_338);
    local_370._M_head_impl = (JoinFilterPushdownInfo *)operator_new(0x48);
    pvVar11 = &((local_370._M_head_impl)->join_condition).
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>;
    (pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &((local_370._M_head_impl)->join_condition).
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    pvVar10 = &((local_370._M_head_impl)->probe_info).
               super_vector<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
    ;
    (pvVar10->
    super__Vector_base<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar10->
    super__Vector_base<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar8 = &((local_370._M_head_impl)->min_max_aggregates).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ;
    (pvVar8->
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar8->
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_370._M_head_impl)->min_max_aggregates).
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328.
    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (JoinFilterPushdownColumn *)0x0;
    local_328.
    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_328.
    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_358.
                   super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    local_358.
    super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>.
    _M_impl.super__Vector_impl_data._0_16_ = auVar6 << 0x40;
    if ((join->conditions).
        super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
        super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (join->conditions).
        super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
        super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __n = (undefined1 *)0x0;
      do {
        pvVar16 = vector<duckdb::JoinCondition,_true>::operator[](local_338,(size_type)__n);
        if ((pvVar16->comparison == COMPARE_BOUNDARY_START) &&
           (pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(&pvVar16->left),
           (pEVar17->super_BaseExpression).type == BOUND_COLUMN_REF)) {
          pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(&pvVar16->left);
          uVar15 = (uint)(pEVar17->return_type).physical_type_;
          if (((0x1d < uVar15) || ((0x21800000U >> (uVar15 & 0x1f) & 1) == 0)) &&
             (pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->(&pvVar16->left), (pEVar17->return_type).id_ != INTERVAL)) {
            local_298._8_4_ = 0xffffffff;
            local_298._0_8_ = 0xffffffffffffffff;
            uStack_28c = 0xffffffff;
            pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(&pvVar16->left);
            pBVar18 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                                (&pEVar17->super_BaseExpression);
            _local_298 = pBVar18->binding;
            if (local_328.
                super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_328.
                super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::
              vector<duckdb::JoinFilterPushdownColumn,std::allocator<duckdb::JoinFilterPushdownColumn>>
              ::_M_realloc_insert<duckdb::JoinFilterPushdownColumn_const&>
                        ((vector<duckdb::JoinFilterPushdownColumn,std::allocator<duckdb::JoinFilterPushdownColumn>>
                          *)&local_328,
                         (iterator)
                         local_328.
                         super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (JoinFilterPushdownColumn *)local_298);
            }
            else {
              iVar3 = (pBVar18->binding).column_index;
              ((local_328.
                super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                ._M_impl.super__Vector_impl_data._M_finish)->probe_column_index).table_index =
                   (pBVar18->binding).table_index;
              ((local_328.
                super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                ._M_impl.super__Vector_impl_data._M_finish)->probe_column_index).column_index =
                   iVar3;
              local_328.
              super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_328.
                   super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            pJVar19 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                      ::operator->((unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                                    *)&local_370);
            __position._M_current =
                 (pJVar19->join_condition).
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pJVar19->join_condition).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)pJVar19,__position,
                         (unsigned_long *)&local_358);
            }
            else {
              *__position._M_current =
                   (unsigned_long)
                   local_358.
                   super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              (pJVar19->join_condition).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
        }
        __n = (undefined1 *)
              ((long)&(local_358.
                       super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                       ._M_impl.super__Vector_impl_data._M_start)->get + 1);
        local_358.
        super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)__n;
      } while (__n < (undefined1 *)
                     (((long)(join->conditions).
                             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                             .
                             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(join->conditions).
                             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                             .
                             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))
      ;
    }
    if (local_328.
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_328.
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_358.
      super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.
      super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.
      super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_01 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::operator[](&(join->super_LogicalJoin).super_LogicalOperator.children,0);
      op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(this_01);
      ::std::
      vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>::
      vector(&local_2c0,&local_328);
      GetPushdownFilterTargets
                (op,(vector<duckdb::JoinFilterPushdownColumn,_true> *)&local_2c0,
                 (vector<duckdb::PushdownFilterTarget,_true> *)&local_358);
      local_310 = join;
      local_2e0 = this;
      if (local_2c0.
          super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2c0.
                        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      pPVar13 = local_358.
                super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_358.
          super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_358.
          super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_340 = (_func_int **)&PTR___Sp_counted_ptr_inplace_02477b10;
        pPVar26 = local_358.
                  super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pLVar1 = pPVar26->get;
          if ((pLVar1->dynamic_filters).internal.
              super___shared_ptr<duckdb::DynamicTableFilterSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (element_type *)0x0) {
            this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
            this_02->_M_use_count = 1;
            this_02->_M_weak_count = 1;
            this_02->_vptr__Sp_counted_base = local_340;
            this_02[3]._vptr__Sp_counted_base = (_func_int **)0x0;
            this_02[3]._M_use_count = 0;
            this_02[3]._M_weak_count = 0;
            this_02[4]._vptr__Sp_counted_base = (_func_int **)0x0;
            this_02[4]._M_use_count = 0;
            this_02[4]._M_weak_count = 0;
            this_02[5]._vptr__Sp_counted_base = (_func_int **)0x0;
            this_02[5]._M_use_count = 0;
            this_02[5]._M_weak_count = 0;
            this_02[1]._vptr__Sp_counted_base = (_func_int **)0x0;
            this_02[1]._M_use_count = 0;
            this_02[1]._M_weak_count = 0;
            this_02[2]._vptr__Sp_counted_base = (_func_int **)0x0;
            this_02[2]._M_use_count = 0;
            this_02[2]._M_weak_count = 0;
            *(_Atomic_word **)&this_02[3]._M_use_count = &this_02[6]._M_use_count;
            this_02[4]._vptr__Sp_counted_base = (_func_int **)0x1;
            *(undefined1 (*) [16])&this_02[4]._M_use_count = (undefined1  [16])0x0;
            this_02[5]._M_use_count = 0x3f800000;
            this_02[6]._vptr__Sp_counted_base = (_func_int **)0x0;
            this_02[6]._M_use_count = 0;
            this_02[6]._M_weak_count = 0;
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_02->_M_use_count = this_02->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_02->_M_use_count = 2;
            }
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
            (pLVar1->dynamic_filters).internal.
            super___shared_ptr<duckdb::DynamicTableFilterSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)(this_02 + 1);
            this_00 = (pLVar1->dynamic_filters).internal.
                      super___shared_ptr<duckdb::DynamicTableFilterSet,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            (pLVar1->dynamic_filters).internal.
            super___shared_ptr<duckdb::DynamicTableFilterSet,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = this_02;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
          }
          local_288._0_16_ = (undefined1  [16])0x0;
          local_298._0_8_ = 0;
          stack0xfffffffffffffd70 = 0;
          local_288._16_8_ = (pointer)0x0;
          shared_ptr<duckdb::DynamicTableFilterSet,_true>::operator=
                    ((shared_ptr<duckdb::DynamicTableFilterSet,_true> *)local_298,
                     &pLVar1->dynamic_filters);
          uVar14 = local_288._0_8_;
          pvVar9 = &(pPVar26->columns).
                    super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          ;
          auVar7._0_8_ = (pvVar9->
                         super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                         )._M_impl.super__Vector_impl_data._M_start;
          auVar7._8_8_ = (pvVar9->
                         super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
          pJVar2 = (pPVar26->columns).
                   super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                   .
                   super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pPVar26->columns).
          super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          .
          super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_288._0_8_;
          (pPVar26->columns).
          super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          .
          super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_288._8_8_;
          (pPVar26->columns).
          super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          .
          super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_288._16_8_;
          pvVar9 = &(pPVar26->columns).
                    super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          ;
          (pvVar9->
          super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar9->
          super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pPVar26->columns).
          super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          .
          super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar27 = (pointer)local_288._0_8_ != (pointer)0x0;
          local_288._0_16_ = auVar7;
          local_288._16_8_ = pJVar2;
          if (bVar27) {
            operator_delete((void *)uVar14);
          }
          pJVar19 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                    ::operator->((unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                                  *)&local_370);
          ::std::
          vector<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
          ::emplace_back<duckdb::JoinFilterPushdownFilter>
                    (&(pJVar19->probe_info).
                      super_vector<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
                     ,(JoinFilterPushdownFilter *)local_298);
          if ((pointer)local_288._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_288._0_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stack0xfffffffffffffd70 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stack0xfffffffffffffd70);
          }
          pPVar26 = pPVar26 + 1;
        } while (pPVar26 != pPVar13);
      }
      if ((((local_310->super_LogicalJoin).super_LogicalOperator.field_0x61 == '\x03') &&
          ((long)(local_310->conditions).
                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_310->conditions).
                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 _M_impl.super__Vector_impl_data._M_start == 0x18)) &&
         (pJVar19 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                    ::operator->((unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                                  *)&local_370),
         (long)(pJVar19->join_condition).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
               .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pJVar19->join_condition).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
               .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start == 8)) {
        pvVar16 = vector<duckdb::JoinCondition,_true>::operator[](local_338,0);
        pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(&pvVar16->right);
        bVar27 = TypeIsIntegral((pEVar17->return_type).physical_type_);
      }
      else {
        bVar27 = false;
      }
      pJVar19 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                ::operator->((unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                              *)&local_370);
      if (bVar27 != false ||
          (pJVar19->probe_info).
          super_vector<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
          .
          super__Vector_base<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pJVar19->probe_info).
          super_vector<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
          .
          super__Vector_base<duckdb::JoinFilterPushdownFilter,_std::allocator<duckdb::JoinFilterPushdownFilter>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_308 = (undefined1  [16])0x0;
        local_2f8 = (pointer)0x0;
        MinFunction::GetFunction();
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                   local_308,(AggregateFunction *)local_298);
        local_298._0_8_ = &PTR__AggregateFunction_02476990;
        if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
        }
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_298);
        MaxFunction::GetFunction();
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                   local_308,(AggregateFunction *)local_298);
        local_298._0_8_ = &PTR__AggregateFunction_02476990;
        if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
        }
        BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_298);
        pJVar19 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                  ::operator->((unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                                *)&local_370);
        psVar22 = (pJVar19->join_condition).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_2e8 = (pJVar19->join_condition).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        if (psVar22 != local_2e8) {
          local_340 = (_func_int **)&PTR__BaseScalarFunction_02482b00;
          do {
            uVar14 = local_308._8_8_;
            for (pAVar23 = (pointer)local_308._0_8_; pAVar23 != (pointer)uVar14;
                pAVar23 = pAVar23 + 1) {
              FunctionBinder::FunctionBinder
                        ((FunctionBinder *)local_2a8,local_2e0->optimizer->context);
              local_298._0_8_ = 0;
              stack0xfffffffffffffd70 = 0;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = local_288._8_8_;
              local_288._0_16_ = auVar4 << 0x40;
              pvVar16 = vector<duckdb::JoinCondition,_true>::operator[](local_338,*psVar22);
              pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->(&pvVar16->right);
              (*(pEVar17->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_368,pEVar17);
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                          *)local_298,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&local_368);
              if (local_368.binder.ptr != (Binder *)0x0) {
                (*(code *)((((local_368.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                            __weak_this_.internal.
                            super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)();
              }
              SimpleFunction::SimpleFunction
                        (&local_160.super_SimpleFunction,(SimpleFunction *)pAVar23);
              local_160.super_SimpleFunction.super_Function._vptr_Function = local_340;
              LogicalType::LogicalType
                        (&local_160.return_type,&(pAVar23->super_BaseScalarFunction).return_type);
              local_160.stability = (pAVar23->super_BaseScalarFunction).stability;
              local_160.null_handling = (pAVar23->super_BaseScalarFunction).null_handling;
              local_160.errors = (pAVar23->super_BaseScalarFunction).errors;
              local_160.collation_handling = (pAVar23->super_BaseScalarFunction).collation_handling;
              local_160.super_SimpleFunction.super_Function._vptr_Function =
                   (_func_int **)&PTR__AggregateFunction_02476990;
              pp_Var24 = &pAVar23->state_size;
              puVar25 = local_b0;
              for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
                *puVar25 = *pp_Var24;
                pp_Var24 = pp_Var24 + (ulong)bVar28 * -2 + 1;
                puVar25 = puVar25 + (ulong)bVar28 * -2 + 1;
              }
              local_48._0_1_ = pAVar23->order_dependent;
              local_48._1_1_ = pAVar23->distinct_dependent;
              local_40 = (pAVar23->function_info).internal.
                         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
              local_38 = (pAVar23->function_info).internal.
                         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
              if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_38->_M_use_count = local_38->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_38->_M_use_count = local_38->_M_use_count + 1;
                }
              }
              local_2d8.
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_298._0_8_;
              local_2d8.
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)stack0xfffffffffffffd70;
              local_2d8.
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_288._0_8_;
              local_298._0_8_ = 0;
              stack0xfffffffffffffd70 = 0;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = local_288._8_8_;
              local_288._0_16_ = auVar5 << 0x40;
              local_368.context = (ClientContext *)0x0;
              FunctionBinder::BindAggregateFunction
                        (&local_368,(AggregateFunction *)local_2a8,
                         (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)&local_160,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&local_2d8,(AggregateType)&local_368.context);
              if (local_368.context != (ClientContext *)0x0) {
                (*(code *)((((local_368.context)->
                            super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                            internal.
                            super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).
                          __weak_this_.internal.
                          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)();
              }
              local_368.context = (ClientContext *)0x0;
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::~vector(&local_2d8);
              local_160.super_SimpleFunction.super_Function._vptr_Function =
                   (_func_int **)&PTR__AggregateFunction_02476990;
              if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
              }
              BaseScalarFunction::~BaseScalarFunction(&local_160);
              pBVar20 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                        ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                                      *)&local_368);
              if ((long)(pBVar20->children).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pBVar20->children).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 8) {
                if (local_368.binder.ptr != (Binder *)0x0) {
                  (*(code *)((((local_368.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>
                              ).__weak_this_.internal.
                              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                            super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                            super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            ._M_pi)();
                }
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           *)local_298);
                goto LAB_00d61bcc;
              }
              pJVar19 = unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                        ::operator->((unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                                      *)&local_370);
              local_330._M_head_impl = (Expression *)local_368.binder.ptr;
              local_368.binder.ptr = (Binder *)0x0;
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                          *)&pJVar19->min_max_aggregates,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&local_330);
              if ((Binder *)local_330._M_head_impl != (Binder *)0x0) {
                (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                             &((local_330._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)
                            ->internal).super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                          internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)();
              }
              if (local_368.binder.ptr != (Binder *)0x0) {
                (*(code *)((((local_368.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                            __weak_this_.internal.
                            super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                          super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)();
              }
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         *)local_298);
            }
            psVar22 = psVar22 + 1;
          } while (psVar22 != local_2e8);
        }
        _Var12._M_head_impl = local_370._M_head_impl;
        local_370._M_head_impl = (JoinFilterPushdownInfo *)0x0;
        __ptr._M_head_impl =
             (local_310->filter_pushdown).
             super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
             .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl;
        (local_310->filter_pushdown).
        super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
        .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl =
             _Var12._M_head_impl;
        if (__ptr._M_head_impl != (JoinFilterPushdownInfo *)0x0) {
          ::std::default_delete<duckdb::JoinFilterPushdownInfo>::operator()
                    ((default_delete<duckdb::JoinFilterPushdownInfo> *)&local_310->filter_pushdown,
                     __ptr._M_head_impl);
        }
LAB_00d61bcc:
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        ~vector((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                local_308);
      }
      ::std::vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>::
      ~vector(&local_358);
    }
    if (local_328.
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_328.
                      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_370._M_head_impl != (JoinFilterPushdownInfo *)0x0) {
      ::std::default_delete<duckdb::JoinFilterPushdownInfo>::operator()
                ((default_delete<duckdb::JoinFilterPushdownInfo> *)&local_370,local_370._M_head_impl
                );
    }
  }
  return;
}

Assistant:

void JoinFilterPushdownOptimizer::GenerateJoinFilters(LogicalComparisonJoin &join) {
	switch (join.join_type) {
	case JoinType::MARK:
	case JoinType::SINGLE:
	case JoinType::LEFT:
	case JoinType::OUTER:
	case JoinType::ANTI:
	case JoinType::RIGHT_ANTI:
	case JoinType::RIGHT_SEMI:
		// cannot generate join filters for these join types
		// mark/single - cannot change cardinality of probe side
		// left/outer always need to include every row from probe side
		// FIXME: anti/right_anti - we could do this, but need to invert the join conditions
		return;
	default:
		break;
	}
	// re-order conditions here - otherwise this will happen later on and invalidate the indexes we generate
	PhysicalComparisonJoin::ReorderConditions(join.conditions);
	auto pushdown_info = make_uniq<JoinFilterPushdownInfo>();

	vector<JoinFilterPushdownColumn> pushdown_columns;
	for (idx_t cond_idx = 0; cond_idx < join.conditions.size(); cond_idx++) {
		auto &cond = join.conditions[cond_idx];
		if (cond.comparison != ExpressionType::COMPARE_EQUAL) {
			// only equality supported for now
			continue;
		}
		if (cond.left->GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
			// only bound column ref supported for now
			continue;
		}
		if (cond.left->return_type.IsNested()) {
			// nested columns are not supported for pushdown
			continue;
		}
		if (cond.left->return_type.id() == LogicalTypeId::INTERVAL) {
			// interval is not supported for pushdown
			continue;
		}
		JoinFilterPushdownColumn pushdown_col;
		auto &colref = cond.left->Cast<BoundColumnRefExpression>();
		pushdown_col.probe_column_index = colref.binding;
		pushdown_columns.push_back(pushdown_col);

		pushdown_info->join_condition.push_back(cond_idx);
	}
	if (pushdown_columns.empty()) {
		// could not generate any filters - bail-out
		return;
	}
	// recurse the query tree to find the LogicalGets in which we can push the filter info
	vector<PushdownFilterTarget> pushdown_filter_targets;
	GetPushdownFilterTargets(*join.children[0], pushdown_columns, pushdown_filter_targets);
	for (auto &target : pushdown_filter_targets) {
		auto &get = target.get;
		// pushdown info can be applied to this LogicalGet - push the dynamic table filter set
		if (!get.dynamic_filters) {
			get.dynamic_filters = make_shared_ptr<DynamicTableFilterSet>();
		}

		JoinFilterPushdownFilter get_filter;
		get_filter.dynamic_filters = get.dynamic_filters;
		get_filter.columns = std::move(target.columns);
		pushdown_info->probe_info.push_back(std::move(get_filter));
	}

	// Even if we cannot find any table sources in which we can push down filters,
	// we still initialize the aggregate states so that we have the possibility of doing a perfect hash join
	const auto compute_aggregates_anyway = join.join_type == JoinType::INNER && join.conditions.size() == 1 &&
	                                       pushdown_info->join_condition.size() == 1 &&
	                                       TypeIsIntegral(join.conditions[0].right->return_type.InternalType());
	if (pushdown_info->probe_info.empty() && !compute_aggregates_anyway) {
		// no table sources found in which we can push down filters
		return;
	}

	// set up the min/max aggregates for each of the filters
	vector<AggregateFunction> aggr_functions;
	aggr_functions.push_back(MinFunction::GetFunction());
	aggr_functions.push_back(MaxFunction::GetFunction());
	for (auto &join_condition : pushdown_info->join_condition) {
		for (auto &aggr : aggr_functions) {
			FunctionBinder function_binder(optimizer.GetContext());
			vector<unique_ptr<Expression>> aggr_children;
			aggr_children.push_back(join.conditions[join_condition].right->Copy());
			auto aggr_expr = function_binder.BindAggregateFunction(aggr, std::move(aggr_children), nullptr,
			                                                       AggregateType::NON_DISTINCT);
			if (aggr_expr->children.size() != 1) {
				// min/max with collation - not supported
				return;
			}
			pushdown_info->min_max_aggregates.push_back(std::move(aggr_expr));
		}
	}
	// set up the filter pushdown in the join itself
	join.filter_pushdown = std::move(pushdown_info);
}